

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ma.c
# Opt level: O2

ErrorNumber do_test_ma(TA_History *history,TA_Test_conflict6 *test,int testMAVP)

{
  TA_TestId TVar1;
  TA_Real *originalInput;
  TA_RetCode TVar2;
  ErrorNumber EVar3;
  int iVar4;
  int iVar5;
  TA_FuncUnstId unstId;
  TA_Integer TVar6;
  TA_Real *pTVar7;
  TestBuffer *pTVar8;
  TA_Real *pTVar9;
  uint uVar10;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_RangeTestParam_conflict6 testParam;
  
  if ((testMAVP != 0) && (test->id != TA_ANY_MA_TEST)) {
    return TA_TEST_PASS;
  }
  TA_SetCompatibility(test->compatibility);
  clearAllBuffers();
  setInputBuffer(0,history->close,history->nbBars);
  setInputBuffer(1,history->close,history->nbBars);
  if (testMAVP != 0) {
    setInputBufferValue(2,(double)test->optInTimePeriod,history->nbBars);
  }
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
  iVar4 = test->optInMAType_1;
  uVar10 = iVar4 - 1;
  if ((uVar10 < 8) && ((0xedU >> (uVar10 & 0x1f) & 1) != 0)) {
    TVar2 = TA_SetUnstablePeriod
                      (*(TA_FuncUnstId *)(&DAT_00180fc8 + (ulong)uVar10 * 4),test->unstablePeriod);
    if (TVar2 != TA_SUCCESS) {
      return TA_TEST_TFRR_SETUNSTABLE_PERIOD_FAIL;
    }
    iVar4 = test->optInMAType_1;
  }
  if (iVar4 == 7) {
    TA_MEDPRICE(0,history->nbBars - 1,history->high,history->low,&outBegIdx,&outNbElement,
                gBuffer[0].in);
    TA_MEDPRICE(0,history->nbBars - 1,history->high,history->low,&outBegIdx,&outNbElement,
                gBuffer[1].in);
    pTVar8 = gBuffer + 2;
    TA_MEDPRICE(0,history->nbBars - 1,history->high,history->low,&outBegIdx,&outNbElement,
                gBuffer[2].in);
  }
  else {
    pTVar8 = (TestBuffer *)&history->close;
  }
  originalInput = pTVar8->in;
  TVar1 = test->id;
  if (TVar1 == TA_ADOSC_3_10_TEST) {
    TVar6 = test->startIdx;
    iVar4 = test->endIdx;
    pTVar7 = gBuffer[0].out2;
    pTVar9 = gBuffer[0].out0;
LAB_00116626:
    TVar2 = TA_MAMA(TVar6,iVar4,gBuffer[0].in,0.5,0.05,&outBegIdx,&outNbElement,pTVar7,pTVar9);
  }
  else {
    if (TVar1 == TA_AD_TEST) {
      TVar6 = test->startIdx;
      iVar4 = test->endIdx;
      pTVar7 = gBuffer[0].out0;
      pTVar9 = gBuffer[0].out2;
      goto LAB_00116626;
    }
    TVar2 = TA_SUCCESS;
    if (TVar1 == TA_ANY_MA_TEST) {
      if (testMAVP == 0) {
        TVar2 = TA_MA(test->startIdx,test->endIdx,gBuffer[0].in,test->optInTimePeriod,
                      test->optInMAType_1,&outBegIdx,&outNbElement,gBuffer[0].out0);
      }
      else {
        TVar2 = TA_MAVP(test->startIdx,test->endIdx,gBuffer[0].in,gBuffer[2].in,2,
                        test->optInTimePeriod,test->optInMAType_1,&outBegIdx,&outNbElement,
                        gBuffer[0].out0);
      }
    }
  }
  EVar3 = checkDataSame(gBuffer[0].in,originalInput,history->nbBars);
  if (EVar3 != TA_TEST_PASS) {
    return EVar3;
  }
  EVar3 = checkExpectedValue(gBuffer[0].out0,TVar2,test->expectedRetCode,outBegIdx,
                             test->expectedBegIdx,outNbElement,test->expectedNbElement,
                             test->oneOfTheExpectedOutReal,test->oneOfTheExpectedOutRealIndex);
  if (EVar3 != TA_TEST_PASS) {
    return EVar3;
  }
  outNbElement = 0;
  outBegIdx = 0;
  TVar1 = test->id;
  if (TVar1 == TA_ADOSC_3_10_TEST) {
    TVar6 = test->startIdx;
    iVar4 = test->endIdx;
    pTVar7 = gBuffer[0].out2;
    pTVar9 = gBuffer[1].in;
LAB_0011675f:
    TVar2 = TA_MAMA(TVar6,iVar4,gBuffer[1].in,0.5,0.05,&outBegIdx,&outNbElement,pTVar7,pTVar9);
  }
  else {
    if (TVar1 == TA_AD_TEST) {
      TVar6 = test->startIdx;
      iVar4 = test->endIdx;
      pTVar7 = gBuffer[1].in;
      pTVar9 = gBuffer[0].out2;
      goto LAB_0011675f;
    }
    if (TVar1 == TA_ANY_MA_TEST) {
      if (testMAVP == 0) {
        TVar2 = TA_MA(test->startIdx,test->endIdx,gBuffer[1].in,test->optInTimePeriod,
                      test->optInMAType_1,&outBegIdx,&outNbElement,gBuffer[1].in);
      }
      else {
        TVar2 = TA_MAVP(test->startIdx,test->endIdx,gBuffer[1].in,gBuffer[2].in,2,
                        test->optInTimePeriod,test->optInMAType_1,&outBegIdx,&outNbElement,
                        gBuffer[1].in);
      }
    }
  }
  EVar3 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
  if (EVar3 != TA_TEST_PASS) {
    return EVar3;
  }
  EVar3 = checkExpectedValue(gBuffer[1].in,TVar2,test->expectedRetCode,outBegIdx,
                             test->expectedBegIdx,outNbElement,test->expectedNbElement,
                             test->oneOfTheExpectedOutReal,test->oneOfTheExpectedOutRealIndex);
  if (EVar3 != TA_TEST_PASS) {
    return EVar3;
  }
  iVar4 = test->optInTimePeriod;
  if (1 < iVar4) {
    switch(test->optInMAType_1) {
    case 0:
      iVar4 = TA_SMA_Lookback(iVar4);
      break;
    case 1:
      iVar4 = TA_EMA_Lookback(iVar4);
      break;
    case 2:
      iVar4 = TA_WMA_Lookback(iVar4);
      break;
    case 3:
      iVar4 = TA_DEMA_Lookback(iVar4);
      break;
    case 4:
      iVar4 = TA_TEMA_Lookback(iVar4);
      break;
    case 5:
      iVar4 = TA_TRIMA_Lookback(iVar4);
      break;
    case 6:
      iVar4 = TA_KAMA_Lookback(iVar4);
      break;
    case 7:
      iVar4 = TA_MAMA_Lookback(0.5,0.05);
      break;
    case 8:
      iVar4 = TA_T3_Lookback(iVar4,0.7);
      break;
    default:
      return TA_TEST_TFRR_BAD_MA_TYPE;
    }
    iVar5 = TA_MA_Lookback(test->optInTimePeriod,test->optInMAType_1);
    if (iVar4 != iVar5) {
      printf("\nFailed for MA Type #%d for period %d\n",(ulong)(uint)test->optInMAType_1,
             (ulong)(uint)test->optInTimePeriod);
      return TA_TEST_TFFR_BAD_MA_LOOKBACK;
    }
  }
  testParam.mavpPeriod = gBuffer[2].in;
  if (test->doRangeTestFlag == 0) {
    return TA_TEST_PASS;
  }
  switch(test->optInMAType_1) {
  case 1:
  case 3:
  case 4:
    unstId = TA_FUNC_UNST_EMA;
    break;
  default:
    unstId = TA_FUNC_UNST_NONE;
    break;
  case 6:
    unstId = TA_FUNC_UNST_KAMA;
    break;
  case 7:
    unstId = TA_FUNC_UNST_MAMA;
    uVar10 = 2;
    goto LAB_001168e3;
  case 8:
    unstId = TA_FUNC_UNST_T3;
  }
  uVar10 = 1;
LAB_001168e3:
  testParam.test = test;
  testParam.close = originalInput;
  testParam.testMAVP = testMAVP;
  EVar3 = doRangeTest(rangeTestFunction,unstId,&testParam,uVar10,0);
  if (EVar3 == TA_TEST_PASS) {
    return TA_TEST_PASS;
  }
  return EVar3;
}

Assistant:

static ErrorNumber do_test_ma( const TA_History *history,
                               const TA_Test *test,
							   int testMAVP )
{
   TA_RetCode retCode;
   ErrorNumber errNb;
   TA_Integer outBegIdx;
   TA_Integer outNbElement;
   TA_RangeTestParam testParam;
   TA_Integer temp, temp2;
   const TA_Real *referenceInput;

   /* TA_MAVP is tested only for TA_ANY_MA_TEST */
   if( testMAVP && (test->id != TA_ANY_MA_TEST) )
   {
      return TA_TEST_PASS;
   }

   TA_SetCompatibility( (TA_Compatibility)test->compatibility );

   /* Set to NAN all the elements of the gBuffers.  */
   clearAllBuffers();

   /* Build the input. */
   setInputBuffer( 0, history->close, history->nbBars );
   setInputBuffer( 1, history->close, history->nbBars );
   if( testMAVP )
   {
      setInputBufferValue( 2, test->optInTimePeriod, history->nbBars );
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* Set the unstable period requested for that test. */
   switch( test->optInMAType_1 )
   {
   case TA_MAType_TEMA:
   case TA_MAType_DEMA:
   case TA_MAType_EMA:
      retCode = TA_SetUnstablePeriod( TA_FUNC_UNST_EMA, test->unstablePeriod );
      break;
   case TA_MAType_KAMA:
      retCode = TA_SetUnstablePeriod( TA_FUNC_UNST_KAMA, test->unstablePeriod );
      break;
   case TA_MAType_MAMA:
      retCode = TA_SetUnstablePeriod( TA_FUNC_UNST_MAMA, test->unstablePeriod );
      break;
   case TA_MAType_T3:
      retCode = TA_SetUnstablePeriod( TA_FUNC_UNST_T3, test->unstablePeriod );
      break;
   default:
      retCode = TA_SUCCESS;
      break;
   }

   if( retCode != TA_SUCCESS )
      return TA_TEST_TFRR_SETUNSTABLE_PERIOD_FAIL;

   /* Transform the inputs for MAMA (it is an AVGPRICE in John Ehlers book). */
   if( test->optInMAType_1 == TA_MAType_MAMA )
   {
      TA_MEDPRICE( 0, history->nbBars-1, history->high, history->low,
                   &outBegIdx, &outNbElement, gBuffer[0].in );

      TA_MEDPRICE( 0, history->nbBars-1, history->high, history->low,
                   &outBegIdx, &outNbElement, gBuffer[1].in );

      /* Will be use as reference */
      TA_MEDPRICE( 0, history->nbBars-1, history->high, history->low,
                   &outBegIdx, &outNbElement, gBuffer[2].in );
      referenceInput = gBuffer[2].in;
   }
   else
      referenceInput = history->close;



   /* Make a simple first call. */
   switch( test->id )
   {
   case TA_ANY_MA_TEST:
	  if(testMAVP)
	  {
         retCode = TA_MAVP( test->startIdx,
                            test->endIdx,
                            gBuffer[0].in,
							gBuffer[2].in,
							2, test->optInTimePeriod,
                            (TA_MAType)test->optInMAType_1,
                            &outBegIdx,
                            &outNbElement,
                            gBuffer[0].out0 );
	  }
	  else
	  {
         retCode = TA_MA( test->startIdx,
                          test->endIdx,
                          gBuffer[0].in,
                          test->optInTimePeriod,
                          (TA_MAType)test->optInMAType_1,
                          &outBegIdx,
                          &outNbElement,
                          gBuffer[0].out0 );
	  }
      break;
   case TA_MAMA_TEST:
      retCode = TA_MAMA( test->startIdx,
                         test->endIdx,
                         gBuffer[0].in,
                         0.5, 0.05,
                         &outBegIdx,
                         &outNbElement,
                         gBuffer[0].out0,
                         gBuffer[0].out2 );

     break;
   case TA_FAMA_TEST:
      retCode = TA_MAMA( test->startIdx,
                         test->endIdx,
                         gBuffer[0].in,
                         0.5, 0.05,
                         &outBegIdx,
                         &outNbElement,
                         gBuffer[0].out2,
                         gBuffer[0].out0 );

     break;
   }

   errNb = checkDataSame( gBuffer[0].in, referenceInput, history->nbBars );
   if( errNb != TA_TEST_PASS )
      return errNb;

   errNb = checkExpectedValue( gBuffer[0].out0,
                               retCode, test->expectedRetCode,
                               outBegIdx, test->expectedBegIdx,
                               outNbElement, test->expectedNbElement,
                               test->oneOfTheExpectedOutReal,
                               test->oneOfTheExpectedOutRealIndex );
   if( errNb != TA_TEST_PASS )
      return errNb;

   outBegIdx = outNbElement = 0;

   /* Make another call where the input and the output are the
    * same buffer.
    */
   switch( test->id )
   {
   case TA_ANY_MA_TEST:
	  if(testMAVP)
   	  {
      retCode = TA_MAVP( test->startIdx,
                       test->endIdx,
                       gBuffer[1].in,
					   gBuffer[2].in,
                       2,test->optInTimePeriod,
                       (TA_MAType)test->optInMAType_1,
                       &outBegIdx,
                       &outNbElement,
                       gBuffer[1].in );
	  }
	  else
	  {
      retCode = TA_MA( test->startIdx,
                       test->endIdx,
                       gBuffer[1].in,
                       test->optInTimePeriod,
                       (TA_MAType)test->optInMAType_1,
                       &outBegIdx,
                       &outNbElement,
                       gBuffer[1].in );
	  }
      break;
   case TA_MAMA_TEST:
      retCode = TA_MAMA( test->startIdx,
                         test->endIdx,
                         gBuffer[1].in,
                         0.5, 0.05,
                         &outBegIdx,
                         &outNbElement,
                         gBuffer[1].in,
                         gBuffer[0].out2 );
     break;
   case TA_FAMA_TEST:
      retCode = TA_MAMA( test->startIdx,
                         test->endIdx,
                         gBuffer[1].in,
                         0.5, 0.05,
                         &outBegIdx,
                         &outNbElement,
                         gBuffer[0].out2,
                         gBuffer[1].in );
     break;
   }

   /* The previous call to TA_MA should have the same output
    * as this call.
    *
    * checkSameContent verify that all value different than NAN in
    * the first parameter is identical in the second parameter.
    */
   errNb = checkSameContent( gBuffer[0].out0, gBuffer[1].in );
   if( errNb != TA_TEST_PASS )
      return errNb;

   errNb = checkExpectedValue( gBuffer[1].in,
                               retCode, test->expectedRetCode,
                               outBegIdx, test->expectedBegIdx,
                               outNbElement, test->expectedNbElement,
                               test->oneOfTheExpectedOutReal,
                               test->oneOfTheExpectedOutRealIndex );
   if( errNb != TA_TEST_PASS )
      return errNb;

  /* Verify that the "all-purpose" TA_MA_Lookback is consistent
   * with the corresponding moving average lookback function.
   */
   if( test->optInTimePeriod >= 2 )
   {
      switch( test->optInMAType_1 )
      {
      case TA_MAType_WMA:
         temp = TA_WMA_Lookback( test->optInTimePeriod );
         break;

      case TA_MAType_SMA:
         temp = TA_SMA_Lookback( test->optInTimePeriod );
         break;

      case TA_MAType_EMA:
         temp = TA_EMA_Lookback( test->optInTimePeriod );
         break;

      case TA_MAType_DEMA:
         temp = TA_DEMA_Lookback( test->optInTimePeriod );
         break;

      case TA_MAType_TEMA:
         temp = TA_TEMA_Lookback( test->optInTimePeriod );
         break;

      case TA_MAType_KAMA:
         temp = TA_KAMA_Lookback( test->optInTimePeriod );
         break;

      case TA_MAType_MAMA:
         temp = TA_MAMA_Lookback( 0.5, 0.05 );
         break;

      case TA_MAType_TRIMA:
         temp = TA_TRIMA_Lookback( test->optInTimePeriod );
         break;

      case TA_MAType_T3:
         temp = TA_T3_Lookback( test->optInTimePeriod, 0.7 );
         break;

      default:
         return TA_TEST_TFRR_BAD_MA_TYPE;
      }

      temp2 = TA_MA_Lookback( test->optInTimePeriod, (TA_MAType)test->optInMAType_1 );

      if( temp != temp2 )
      {
         printf( "\nFailed for MA Type #%d for period %d\n", test->optInMAType_1, test->optInTimePeriod );
         return TA_TEST_TFFR_BAD_MA_LOOKBACK;
      }
   }

   /* Do a systematic test of most of the
    * possible startIdx/endIdx range.
    */
   testParam.test  = test;
   testParam.close = referenceInput;
   testParam.testMAVP = testMAVP;
   testParam.mavpPeriod = gBuffer[2].in;

   if( test->doRangeTestFlag )
   {
      switch( test->optInMAType_1 )
      {
      case TA_MAType_TEMA:
      case TA_MAType_DEMA:
      case TA_MAType_EMA:
         errNb = doRangeTest( rangeTestFunction,
                              TA_FUNC_UNST_EMA,
                              (void *)&testParam, 1, 0 );
         break;
      case TA_MAType_T3:
         errNb = doRangeTest( rangeTestFunction,
                              TA_FUNC_UNST_T3,
                              (void *)&testParam, 1, 0 );
         break;
      case TA_MAType_KAMA:
         errNb = doRangeTest( rangeTestFunction,
                              TA_FUNC_UNST_KAMA,
                              (void *)&testParam, 1, 0 );
         break;
      case TA_MAType_MAMA:
         errNb = doRangeTest( rangeTestFunction,
                              TA_FUNC_UNST_MAMA,
                              (void *)&testParam, 2, 0 );
         break;
      default:
         errNb = doRangeTest( rangeTestFunction,
                              TA_FUNC_UNST_NONE,
                              (void *)&testParam, 1, 0 );
      }

      if( errNb != TA_TEST_PASS )
         return errNb;
   }

   return TA_TEST_PASS;
}